

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_bytes
          (CmdlineParser *this,char key,string *longkey,uint64_t *dest,string *desc)

{
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  add_bytes(this,key,longkey,&local_50,dest,desc);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CmdlineParser::add_bytes(char key, const std::string& longkey,
                              uint64_t& dest, const std::string& desc) {
    return add_bytes(key, longkey, "", dest, desc);
}